

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O2

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *__ptr;
  long lVar4;
  long lVar5;
  vorbis_info_mapping0 *info;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  __ptr = (int *)calloc(1,0xc90);
  pvVar1 = vi->codec_setup;
  uVar8 = 1;
  lVar4 = oggpack_read(opb,1);
  if (lVar4 != 0) {
    lVar4 = oggpack_read(opb,4);
    uVar8 = (ulong)((int)lVar4 + 1);
  }
  iVar7 = (int)uVar8;
  *__ptr = iVar7;
  lVar4 = oggpack_read(opb,1);
  if (lVar4 == 0) {
LAB_0013161d:
    lVar4 = oggpack_read(opb,2);
    if (lVar4 < 1) {
      if (iVar7 < 2) {
LAB_00131682:
        uVar9 = 0;
        if (iVar7 < 1) {
          uVar8 = uVar9;
        }
        do {
          if (uVar8 == uVar9) {
            return __ptr;
          }
          lVar4 = oggpack_read(opb,8);
          if (*(int *)((long)pvVar1 + 0x18) <= (int)lVar4) break;
          lVar4 = oggpack_read(opb,8);
          __ptr[uVar9 + 0x101] = (int)lVar4;
          if (*(int *)((long)pvVar1 + 0x1c) <= (int)lVar4) break;
          lVar4 = oggpack_read(opb,8);
          __ptr[uVar9 + 0x111] = (int)lVar4;
          uVar9 = uVar9 + 1;
        } while ((int)lVar4 < *(int *)((long)pvVar1 + 0x20));
      }
      else {
        lVar4 = 0;
        do {
          if (vi->channels <= lVar4) goto LAB_00131682;
          lVar5 = oggpack_read(opb,4);
          __ptr[lVar4 + 1] = (int)lVar5;
          lVar4 = lVar4 + 1;
        } while ((int)lVar5 < iVar7);
      }
    }
  }
  else {
    lVar4 = oggpack_read(opb,8);
    iVar2 = (int)lVar4 + 1;
    __ptr[0x123] = iVar2;
    lVar4 = 0;
    do {
      if (iVar2 <= lVar4) goto LAB_0013161d;
      iVar3 = ilog(vi->channels);
      lVar5 = oggpack_read(opb,iVar3);
      iVar6 = (int)lVar5;
      __ptr[lVar4 + 0x124] = iVar6;
      iVar3 = ilog(vi->channels);
      lVar5 = oggpack_read(opb,iVar3);
      iVar3 = (int)lVar5;
      __ptr[lVar4 + 0x224] = iVar3;
    } while ((((-1 < iVar6) && (-1 < iVar3)) && (iVar6 != iVar3)) &&
            ((iVar6 < vi->channels && (lVar4 = lVar4 + 1, iVar3 < vi->channels))));
  }
  free(__ptr);
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  memset(info,0,sizeof(*info));

  if(oggpack_read(opb,1))
    info->submaps=oggpack_read(opb,4)+1;
  else
    info->submaps=1;

  if(oggpack_read(opb,1)){
    info->coupling_steps=oggpack_read(opb,8)+1;

    for(i=0;i<info->coupling_steps;i++){
      int testM=info->coupling_mag[i]=oggpack_read(opb,ilog(vi->channels));
      int testA=info->coupling_ang[i]=oggpack_read(opb,ilog(vi->channels));

      if(testM<0 || 
	 testA<0 || 
	 testM==testA || 
	 testM>=vi->channels ||
	 testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)>0)goto err_out; /* 2,3:reserved */
    
  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    int temp=oggpack_read(opb,8);
    if(temp>=ci->times)goto err_out;
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}